

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview_p.h
# Opt level: O0

void __thiscall QHeaderViewPrivate::setDefaultValues(QHeaderViewPrivate *this,Orientation o)

{
  long lVar1;
  enum_type in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  enum_type in_stack_ffffffffffffffe0;
  QFlagsStorage<Qt::AlignmentFlag> local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(enum_type *)(in_RDI + 0x548) = in_ESI;
  updateDefaultSectionSizeFromStyle
            ((QHeaderViewPrivate *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0));
  if (in_ESI == AlignLeading) {
    QFlags<Qt::AlignmentFlag>::QFlags
              ((QFlags<Qt::AlignmentFlag> *)CONCAT44(1,in_stack_ffffffffffffffe0),
               (AlignmentFlag)((ulong)in_RDI >> 0x20));
  }
  else {
    local_c.i = (Int)Qt::operator|(in_ESI,in_stack_ffffffffffffffe0);
  }
  ((QFlagsStorage<Qt::AlignmentFlag> *)(in_RDI + 0x618))->i = local_c.i;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void setDefaultValues(Qt::Orientation o) {
        orientation = o;
        updateDefaultSectionSizeFromStyle();
        defaultAlignment = (o == Qt::Horizontal
                            ? Qt::Alignment(Qt::AlignCenter)
                            : Qt::AlignLeft|Qt::AlignVCenter);
    }